

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O1

json_t * json_vpack_ex(json_error_t *error,size_t flags,char *fmt,__va_list_tag *ap)

{
  json_t *json;
  json_t *pjVar1;
  va_list ap_copy;
  scanner_t s;
  __va_list_tag local_c8;
  scanner_t local_b0;
  
  if ((fmt == (char *)0x0) || (*fmt == '\0')) {
    jsonp_error_init(error,"<format>");
    jsonp_error_set(error,-1,-1,0,json_error_invalid_argument,"NULL or empty format string");
    pjVar1 = (json_t *)0x0;
  }
  else {
    jsonp_error_init(error,(char *)0x0);
    local_b0.prev_token.line = 0;
    local_b0.prev_token.column = 0;
    local_b0.prev_token.pos = 0;
    local_b0.prev_token.token = '\0';
    local_b0.prev_token._17_7_ = 0;
    local_b0.token.line = 0;
    local_b0.token.column = 0;
    local_b0.token.pos = 0;
    local_b0.token.token = '\0';
    local_b0.token._17_7_ = 0;
    local_b0.next_token.line = 0;
    local_b0.next_token.column = 0;
    local_b0.next_token.pos = 0;
    local_b0.next_token.token = '\0';
    local_b0.next_token._17_7_ = 0;
    local_b0.line = 1;
    local_b0._108_8_ = 0;
    local_b0._116_8_ = 0;
    local_b0.start = fmt;
    local_b0.fmt = fmt;
    local_b0.error = error;
    local_b0.flags = flags;
    next_token(&local_b0);
    local_c8.reg_save_area = ap->reg_save_area;
    local_c8.gp_offset = ap->gp_offset;
    local_c8.fp_offset = ap->fp_offset;
    local_c8.overflow_arg_area = ap->overflow_arg_area;
    json = pack(&local_b0,(va_list *)&local_c8);
    pjVar1 = (json_t *)0x0;
    if (json != (json_t *)0x0) {
      next_token(&local_b0);
      pjVar1 = json;
      if (local_b0.token.token != '\0') {
        json_delete(json);
        set_error(&local_b0,"<format>",json_error_invalid_format,"Garbage after format string");
        pjVar1 = (json_t *)0x0;
      }
    }
  }
  return pjVar1;
}

Assistant:

json_t *json_vpack_ex(json_error_t *error, size_t flags, const char *fmt, va_list ap) {
    scanner_t s;
    va_list ap_copy;
    json_t *value;

    if (!fmt || !*fmt) {
        jsonp_error_init(error, "<format>");
        jsonp_error_set(error, -1, -1, 0, json_error_invalid_argument,
                        "NULL or empty format string");
        return NULL;
    }
    jsonp_error_init(error, NULL);

    scanner_init(&s, error, flags, fmt);
    next_token(&s);

    va_copy(ap_copy, ap);
    value = pack(&s, &ap_copy);
    va_end(ap_copy);

    /* This will cover all situations where s.has_error is true */
    if (!value)
        return NULL;

    next_token(&s);
    if (token(&s)) {
        json_decref(value);
        set_error(&s, "<format>", json_error_invalid_format,
                  "Garbage after format string");
        return NULL;
    }

    return value;
}